

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_hash.c
# Opt level: O2

void * qc_hashtbl_enumnext(QcHashTbl *hashtbl)

{
  void *pvVar1;
  uint uVar2;
  HashEntry *pHVar3;
  
  pHVar3 = hashtbl->cur_entry;
  while( true ) {
    if (pHVar3 != (HashEntry *)0x0) {
      pvVar1 = pHVar3->data;
      hashtbl->cur_entry = pHVar3->next;
      return pvVar1;
    }
    uVar2 = hashtbl->cur_bucket_no + 1;
    hashtbl->cur_bucket_no = uVar2;
    if (hashtbl->bucket_count <= uVar2) break;
    pHVar3 = hashtbl->pp_bucket[uVar2];
    hashtbl->cur_entry = pHVar3;
  }
  return (void *)0x0;
}

Assistant:

void* qc_hashtbl_enumnext(QcHashTbl *hashtbl)
{
    void *data;

	while(NULL == hashtbl->cur_entry)
	{
		hashtbl->cur_bucket_no += 1;
		if(hashtbl->cur_bucket_no >= hashtbl->bucket_count)
		{
			return NULL;
		}
		hashtbl->cur_entry = hashtbl->pp_bucket[hashtbl->cur_bucket_no];
	}

	data = hashtbl->cur_entry->data;

    hashtbl->cur_entry = hashtbl->cur_entry->next;

    return data;
}